

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_unary_expr(gvisitor_t *self,gnode_unary_expr_t *node)

{
  long *plVar1;
  ircode_t *code;
  uint32_t p2;
  uint32_t p1;
  opcode_t op;
  uint32_t lineno;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar1 != (long *)0x0) && ((gravity_class_t *)*plVar1 == gravity_class_function)) {
    code = (ircode_t *)plVar1[0x14];
    gvisit(self,node->expr);
    if (node->op == TOK_OP_ADD) {
      return;
    }
    p2 = ircode_register_pop(code);
    if (p2 == 0xffffffff) {
      report_error(self,&node->base,"Invalid unary expression.");
    }
    p1 = ircode_register_push_temp(code);
    op = NEG;
    if (node->op != TOK_OP_SUB) {
      op = token2opcode(node->op);
    }
    if (node == (gnode_unary_expr_t *)0x0) {
      lineno = 0;
    }
    else {
      lineno = (node->base).token.lineno;
    }
    ircode_add(code,op,p1,p2,0,lineno);
    return;
  }
  report_error(self,&node->base,"Invalid code context.");
  return;
}

Assistant:

static void visit_unary_expr (gvisitor_t *self, gnode_unary_expr_t *node) {
    DEBUG_CODEGEN("visit_unary_expr %s", token_name(node->op));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // unary expression can be:
    //    +    Unary PLUS
    //    -    Unary MINUS
    //    !    Logical NOT
    //    ~    Bitwise NOT

    visit(node->expr);
    if (node->op == TOK_OP_ADD) {
        // +1 is just 1 and more generally +expr is just expr so ignore + and proceed
        return;
    }

    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid unary expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    opcode_t op = (node->op == TOK_OP_SUB) ? NEG : token2opcode(node->op);
	ircode_add(code, op, r1, r2, 0, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}